

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *__s;
  size_type __n;
  string *in_RDI;
  allocator<char> local_35 [19];
  byte local_22;
  allocator<char> local_21;
  char *local_20;
  char *colon;
  char *gtest_output_flag;
  
  colon = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_output_abi_cxx11_);
  local_20 = strchr(colon,0x3a);
  __s = colon;
  local_22 = 0;
  if (local_20 == (char *)0x0) {
    std::allocator<char>::allocator();
    local_22 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_21);
  }
  else {
    __n = (long)local_20 - (long)colon;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,__s,__n,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  if ((local_22 & 1) != 0) {
    std::allocator<char>::~allocator(&local_21);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == nullptr)
             ? std::string(gtest_output_flag)
             : std::string(gtest_output_flag,
                           static_cast<size_t>(colon - gtest_output_flag));
}